

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

uint8_t TransformColorBlue(uint8_t green_to_blue,uint8_t red_to_blue,uint32_t argb)

{
  int8_t color;
  int8_t color_00;
  int iVar1;
  int iVar2;
  uint in_EDX;
  int8_t in_SIL;
  int8_t in_DIL;
  int new_blue;
  int8_t red;
  int8_t green;
  
  color = U32ToS8(in_EDX >> 8);
  color_00 = U32ToS8(in_EDX >> 0x10);
  iVar1 = ColorTransformDelta(in_DIL,color);
  iVar2 = ColorTransformDelta(in_SIL,color_00);
  return ((char)in_EDX - (char)iVar1) - (char)iVar2;
}

Assistant:

static WEBP_INLINE uint8_t TransformColorBlue(uint8_t green_to_blue,
                                              uint8_t red_to_blue,
                                              uint32_t argb) {
  const int8_t green = U32ToS8(argb >>  8);
  const int8_t red   = U32ToS8(argb >> 16);
  int new_blue = argb & 0xff;
  new_blue -= ColorTransformDelta((int8_t)green_to_blue, green);
  new_blue -= ColorTransformDelta((int8_t)red_to_blue, red);
  return (new_blue & 0xff);
}